

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O0

scalar __thiscall
absl::make_unique<MutableS2ShapeIndex::Iterator,MutableS2ShapeIndex::Iterator_const&>
          (absl *this,Iterator *args)

{
  Iterator *this_00;
  Iterator *args_local;
  
  this_00 = (Iterator *)operator_new(0x40);
  MutableS2ShapeIndex::Iterator::Iterator(this_00,args);
  std::unique_ptr<MutableS2ShapeIndex::Iterator,std::default_delete<MutableS2ShapeIndex::Iterator>>
  ::unique_ptr<std::default_delete<MutableS2ShapeIndex::Iterator>,void>
            ((unique_ptr<MutableS2ShapeIndex::Iterator,std::default_delete<MutableS2ShapeIndex::Iterator>>
              *)this,this_00);
  return (__uniq_ptr_data<MutableS2ShapeIndex::Iterator,_std::default_delete<MutableS2ShapeIndex::Iterator>,_true,_true>
          )(__uniq_ptr_data<MutableS2ShapeIndex::Iterator,_std::default_delete<MutableS2ShapeIndex::Iterator>,_true,_true>
            )this;
}

Assistant:

typename memory_internal::MakeUniqueResult<T>::scalar make_unique(
    Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}